

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.h
# Opt level: O3

void __thiscall
Js::InterpreterStackFrame::
OP_CallIExtended<Js::OpLayoutT_CallIExtended<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
          (InterpreterStackFrame *this,
          OpLayoutT_CallIExtended<Js::LayoutSizePolicy<(Js::LayoutSize)0>_> *playout)

{
  ValidateRegValue(this,*(Var *)(this + (ulong)(playout->
                                               super_OpLayoutT_CallI<Js::LayoutSizePolicy<(Js::LayoutSize)0>_>
                                               ).Function * 8 + 0x160),true,true);
}

Assistant:

void OP_ProfiledCallI(const unaligned OpLayoutDynamicProfile<T>* playout) { OP_ProfileCallCommon(playout, OP_CallGetFunc(GetRegAllowStackVar(playout->Function)), Js::CallFlags_None, playout->profileId); }